

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int iVar3;
  int local_30;
  int blkn;
  int p1;
  uchar *st;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = *(int *)((long)&pjVar2[4].start_pass + 4) + -1;
  }
  iVar1 = cinfo->Al;
  for (local_30 = 0; local_30 < cinfo->blocks_in_MCU; local_30 = local_30 + 1) {
    iVar3 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
    if (iVar3 != 0) {
      (*MCU_data[local_30])[0] = (*MCU_data[local_30])[0] | (ushort)(1 << ((byte)iVar1 & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int p1, blkn;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* Encoded data is simply the next bit of the two's-complement DC value */
    if (arith_decode(cinfo, st))
      MCU_data[blkn][0][0] |= p1;
  }

  return TRUE;
}